

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildMessage
          (DescriptorBuilder *this,DescriptorProto *proto,Descriptor *parent,Descriptor *result)

{
  RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange> *this_00;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *this_01;
  Tables *this_02;
  ExtensionRange *pEVar1;
  ReservedRange *pRVar2;
  ExtensionRange *pEVar3;
  Symbol symbol;
  Descriptor *pDVar4;
  string *psVar5;
  string *psVar6;
  Type *proto_00;
  Type *pTVar7;
  Type *proto_01;
  Type *proto_02;
  Type *pTVar8;
  Type *pTVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar10;
  Type *pTVar11;
  Type *pTVar12;
  Type *descriptor;
  iterator iVar13;
  anon_union_8_8_13f84498_for_Symbol_2 aVar14;
  anon_union_8_8_13f84498_for_Symbol_2 aVar15;
  long lVar16;
  int j;
  uint uVar17;
  MessageOptions *orig_options;
  int index;
  ulong uVar18;
  int i_1;
  int iVar19;
  FieldDescriptor *pFVar20;
  int i;
  long lVar21;
  ulong uVar22;
  SubstituteArg local_2b0;
  SubstituteArg local_280;
  SubstituteArg local_250;
  SubstituteArg local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  RepeatedPtrFieldBase *local_190;
  long local_188;
  DescriptorProto *local_180;
  Descriptor *local_178;
  string local_170;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  Descriptor *local_90;
  RepeatedPtrFieldBase *local_88;
  ulong local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  anon_union_8_8_13f84498_for_Symbol_2 aStack_70;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_name_set;
  
  pDVar4 = parent;
  if (parent == (Descriptor *)0x0) {
    pDVar4 = (Descriptor *)this->file_;
  }
  psVar5 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(pDVar4 + 8));
  if (psVar5->_M_string_length != 0) {
    std::__cxx11::string::append((ulong)psVar5,'\x01');
  }
  local_188 = 1;
  std::__cxx11::string::append((string *)psVar5);
  ValidateSymbolName(this,(proto->name_).ptr_,psVar5,&proto->super_Message);
  psVar6 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar6;
  *(string **)(result + 8) = psVar5;
  *(FileDescriptor **)(result + 0x10) = this->file_;
  *(Descriptor **)(result + 0x18) = parent;
  *(undefined2 *)(result + 0x28) = 0;
  iVar19 = (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x38) = iVar19;
  AllocateArray<google::protobuf::OneofDescriptor>(this,iVar19,(OneofDescriptor **)(result + 0x40));
  lVar16 = 0;
  for (lVar21 = 0; lVar21 < (proto->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
      lVar21 = lVar21 + 1) {
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                         (&(proto->oneof_decl_).super_RepeatedPtrFieldBase,(int)lVar21);
    BuildOneof(this,proto_00,result,(OneofDescriptor *)(*(long *)(result + 0x40) + lVar16));
    lVar16 = lVar16 + 0x30;
  }
  iVar19 = (proto->field_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x2c) = iVar19;
  local_90 = result + 0x30;
  AllocateArray<google::protobuf::FieldDescriptor>(this,iVar19,(FieldDescriptor **)local_90);
  local_190 = &(proto->field_).super_RepeatedPtrFieldBase;
  lVar16 = 0;
  for (lVar21 = 0; lVar21 < (proto->field_).super_RepeatedPtrFieldBase.current_size_;
      lVar21 = lVar21 + 1) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (local_190,(int)lVar21);
    BuildField(this,pTVar7,result,(FieldDescriptor *)(*(long *)(result + 0x30) + lVar16));
    lVar16 = lVar16 + 0xa8;
  }
  iVar19 = (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x48) = iVar19;
  AllocateArray<google::protobuf::Descriptor>(this,iVar19,(Descriptor **)(result + 0x50));
  lVar16 = 0;
  for (lVar21 = 0; lVar21 < (proto->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      lVar21 = lVar21 + 1) {
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&(proto->nested_type_).super_RepeatedPtrFieldBase,(int)lVar21);
    BuildMessage(this,proto_01,result,(Descriptor *)(*(long *)(result + 0x50) + lVar16));
    lVar16 = lVar16 + 0xa8;
  }
  iVar19 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x58) = iVar19;
  AllocateArray<google::protobuf::EnumDescriptor>(this,iVar19,(EnumDescriptor **)(result + 0x60));
  lVar16 = 0;
  for (lVar21 = 0; lVar21 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      lVar21 = lVar21 + 1) {
    proto_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(proto->enum_type_).super_RepeatedPtrFieldBase,(int)lVar21);
    BuildEnum(this,proto_02,result,(EnumDescriptor *)(*(long *)(result + 0x60) + lVar16));
    lVar16 = lVar16 + 0x38;
  }
  iVar19 = (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x68) = iVar19;
  pDVar4 = result + 0x70;
  AllocateArray<google::protobuf::Descriptor::ExtensionRange>(this,iVar19,(ExtensionRange **)pDVar4)
  ;
  this_00 = &proto->extension_range_;
  lVar16 = 0;
  for (lVar21 = 0; lVar21 < (proto->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      lVar21 = lVar21 + 1) {
    pTVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,(int)lVar21);
    BuildExtensionRange(this,pTVar8,result,(ExtensionRange *)(*(long *)(result + 0x70) + lVar16));
    lVar16 = lVar16 + 8;
  }
  iVar19 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x78) = iVar19;
  AllocateArray<google::protobuf::FieldDescriptor>(this,iVar19,(FieldDescriptor **)(result + 0x80));
  lVar16 = 0;
  for (lVar21 = 0; lVar21 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
      lVar21 = lVar21 + 1) {
    pTVar7 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->extension_).super_RepeatedPtrFieldBase,(int)lVar21);
    BuildExtension(this,pTVar7,result,(FieldDescriptor *)(*(long *)(result + 0x80) + lVar16));
    lVar16 = lVar16 + 0xa8;
  }
  iVar19 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  *(int *)(result + 0x88) = iVar19;
  local_178 = result + 0x90;
  AllocateArray<google::protobuf::Descriptor::ReservedRange>
            (this,iVar19,(ReservedRange **)local_178);
  this_01 = &proto->reserved_range_;
  lVar16 = 0;
  for (lVar21 = 0; lVar21 < (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
      lVar21 = lVar21 + 1) {
    pTVar9 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                       (&this_01->super_RepeatedPtrFieldBase,(int)lVar21);
    BuildReservedRange(this,pTVar9,result,(ReservedRange *)(*(long *)(result + 0x90) + lVar16));
    lVar16 = lVar16 + 8;
  }
  uVar17 = (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  *(uint *)(result + 0x98) = uVar17;
  aVar15.descriptor = result;
  ppbVar10 = DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>
                       (this->tables_,uVar17);
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(result + 0xa0) = ppbVar10
  ;
  local_88 = &(proto->reserved_name_).super_RepeatedPtrFieldBase;
  uVar22 = 0;
  local_180 = proto;
  uVar18 = (ulong)uVar17;
  if ((int)uVar17 < 1) {
    uVar18 = uVar22;
  }
  for (; uVar18 != uVar22; uVar22 = uVar22 + 1) {
    this_02 = this->tables_;
    pTVar11 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (local_88,(int)uVar22);
    proto = local_180;
    psVar5 = DescriptorPool::Tables::AllocateString(this_02,pTVar11);
    *(string **)(*(long *)(aVar15.descriptor + 0xa0) + uVar22 * 8) = psVar5;
  }
  aVar14 = aVar15;
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(aVar15.descriptor + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (MessageOptions *)0x0) {
      orig_options = (MessageOptions *)&_MessageOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::Descriptor>(this,orig_options,aVar15.descriptor);
  }
  local_78 = 1;
  symbol._4_4_ = uStack_74;
  symbol.type = 1;
  symbol.field_1.descriptor = aVar15.descriptor;
  aStack_70 = aVar15;
  AddSymbol(this,*(string **)(aVar15.descriptor + 8),parent,*(string **)aVar15.descriptor,
            &proto->super_Message,symbol);
  iVar19 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  uVar18 = 0;
  while (index = (int)uVar18, index < iVar19) {
    pTVar9 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                       (&this_01->super_RepeatedPtrFieldBase,index);
    local_80 = uVar18;
    for (uVar17 = index + 1U;
        iVar19 = (proto->reserved_range_).super_RepeatedPtrFieldBase.current_size_,
        (int)uVar17 < iVar19; uVar17 = uVar17 + 1) {
      pTVar12 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                          (&this_01->super_RepeatedPtrFieldBase,uVar17);
      if ((pTVar12->start_ < pTVar9->end_) && (pTVar9->start_ < pTVar12->end_)) {
        psVar5 = *(string **)(aVar14.descriptor + 8);
        descriptor = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                               (&this_01->super_RepeatedPtrFieldBase,(int)uVar18);
        strings::internal::SubstituteArg::SubstituteArg
                  ((SubstituteArg *)&reserved_name_set,pTVar12->start_);
        strings::internal::SubstituteArg::SubstituteArg(&local_120,pTVar12->end_ + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_c0,pTVar9->start_);
        strings::internal::SubstituteArg::SubstituteArg(&local_150,pTVar9->end_ + -1);
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_1f0.text_ = (char *)0x0;
        local_1f0.size_ = -1;
        local_220.text_ = (char *)0x0;
        local_220.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        local_280.text_ = (char *)0x0;
        local_280.size_ = -1;
        local_2b0.text_ = (char *)0x0;
        local_2b0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  ((string *)&local_1c0,
                   (strings *)
                   "Reserved range $0 to $1 overlaps with already-defined range $2 to $3.",
                   (char *)&reserved_name_set,&local_120,&local_c0,&local_150,&local_f0,&local_1f0,
                   &local_220,&local_250,&local_280,&local_2b0,(SubstituteArg *)aVar14.descriptor);
        AddError(this,psVar5,&descriptor->super_Message,NUMBER,(string *)&local_1c0);
        std::__cxx11::string::~string((string *)&local_1c0);
        proto = local_180;
        uVar18 = local_80;
      }
    }
    uVar18 = (ulong)(index + 1U);
  }
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_buckets =
       &reserved_name_set.
        super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_h._M_single_bucket;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_bucket_count = 1;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_element_count = 0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  reserved_name_set.
  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  for (iVar19 = 0; iVar19 < (proto->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
      iVar19 = iVar19 + 1) {
    pTVar11 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (local_88,iVar19);
    iVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&reserved_name_set,pTVar11);
    if (iVar13.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__detail::
      _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&reserved_name_set,pTVar11);
    }
    else {
      local_120.text_ = (pTVar11->_M_dataplus)._M_p;
      local_120.size_ = (int)pTVar11->_M_string_length;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_1f0.text_ = (char *)0x0;
      local_1f0.size_ = -1;
      local_220.text_ = (char *)0x0;
      local_220.size_ = -1;
      local_250.text_ = (char *)0x0;
      local_250.size_ = -1;
      local_280.text_ = (char *)0x0;
      local_280.size_ = -1;
      local_2b0.text_ = (char *)0x0;
      local_2b0.size_ = -1;
      local_1c0.text_ = (char *)0x0;
      local_1c0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_170,(strings *)"Field name \"$0\" is reserved multiple times.",
                 (char *)&local_120,&local_c0,&local_150,&local_f0,&local_1f0,&local_220,&local_250,
                 &local_280,&local_2b0,&local_1c0,(SubstituteArg *)aVar14.descriptor);
      AddError(this,pTVar11,&proto->super_Message,NAME,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
  }
  for (lVar16 = 0; lVar16 < *(int *)(aVar14.descriptor + 0x2c); lVar16 = lVar16 + 1) {
    pFVar20 = *(FieldDescriptor **)local_90 + lVar16 * 0xa8;
    aVar15 = aVar14;
    for (lVar21 = 0; lVar21 < *(int *)(aVar15.descriptor + 0x68); lVar21 = lVar21 + 1) {
      pEVar1 = *(ExtensionRange **)pDVar4;
      if ((pEVar1[lVar21].start <= *(int *)(pFVar20 + 0x38)) &&
         (*(int *)(pFVar20 + 0x38) < pEVar1[lVar21].end)) {
        psVar5 = *(string **)(pFVar20 + 8);
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar21);
        strings::internal::SubstituteArg::SubstituteArg(&local_120,pEVar1[lVar21].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_c0,pEVar1[lVar21].end + -1);
        local_150.text_ = (char *)**(undefined8 **)pFVar20;
        local_150.size_ = *(int *)(*(undefined8 **)pFVar20 + 1);
        strings::internal::SubstituteArg::SubstituteArg(&local_f0,*(int *)(pFVar20 + 0x38));
        local_1f0.text_ = (char *)0x0;
        local_1f0.size_ = -1;
        local_220.text_ = (char *)0x0;
        local_220.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        local_280.text_ = (char *)0x0;
        local_280.size_ = -1;
        local_2b0.text_ = (char *)0x0;
        local_2b0.size_ = -1;
        local_1c0.text_ = (char *)0x0;
        local_1c0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_170,(strings *)"Extension range $0 to $1 includes field \"$2\" ($3).",
                   (char *)&local_120,&local_c0,&local_150,&local_f0,&local_1f0,&local_220,
                   &local_250,&local_280,&local_2b0,&local_1c0,(SubstituteArg *)aVar15.descriptor);
        AddError(this,psVar5,&pTVar8->super_Message,NUMBER,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
      }
    }
    aVar14 = aVar15;
    for (lVar21 = 0; lVar21 < *(int *)(aVar15.descriptor + 0x88); lVar21 = lVar21 + 1) {
      if (((*(ReservedRange **)local_178)[lVar21].start <= *(int *)(pFVar20 + 0x38)) &&
         (*(int *)(pFVar20 + 0x38) < (*(ReservedRange **)local_178)[lVar21].end)) {
        psVar5 = *(string **)(pFVar20 + 8);
        pTVar9 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                           (&this_01->super_RepeatedPtrFieldBase,(int)lVar21);
        local_120.text_ = (char *)**(undefined8 **)pFVar20;
        local_120.size_ = *(int *)(*(undefined8 **)pFVar20 + 1);
        strings::internal::SubstituteArg::SubstituteArg(&local_c0,*(int *)(pFVar20 + 0x38));
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_1f0.text_ = (char *)0x0;
        local_1f0.size_ = -1;
        local_220.text_ = (char *)0x0;
        local_220.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        local_280.text_ = (char *)0x0;
        local_280.size_ = -1;
        local_2b0.text_ = (char *)0x0;
        local_2b0.size_ = -1;
        local_1c0.text_ = (char *)0x0;
        local_1c0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_170,(strings *)"Field \"$0\" uses reserved number $1.",(char *)&local_120,
                   &local_c0,&local_150,&local_f0,&local_1f0,&local_220,&local_250,&local_280,
                   &local_2b0,&local_1c0,(SubstituteArg *)aVar14.descriptor);
        AddError(this,psVar5,&pTVar9->super_Message,NUMBER,&local_170);
        aVar15 = aVar14;
        std::__cxx11::string::~string((string *)&local_170);
        aVar14 = aVar15;
      }
    }
    iVar13 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&reserved_name_set,*(key_type **)pFVar20);
    if (iVar13.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      psVar5 = *(string **)(pFVar20 + 8);
      pTVar7 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                         (local_190,(int)lVar16);
      local_120.text_ = (char *)**(undefined8 **)pFVar20;
      local_120.size_ = *(int *)(*(undefined8 **)pFVar20 + 1);
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_1f0.text_ = (char *)0x0;
      local_1f0.size_ = -1;
      local_220.text_ = (char *)0x0;
      local_220.size_ = -1;
      local_250.text_ = (char *)0x0;
      local_250.size_ = -1;
      local_280.text_ = (char *)0x0;
      local_280.size_ = -1;
      local_2b0.text_ = (char *)0x0;
      local_2b0.size_ = -1;
      local_1c0.text_ = (char *)0x0;
      local_1c0.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_170,(strings *)"Field name \"$0\" is reserved.",(char *)&local_120,&local_c0
                 ,&local_150,&local_f0,&local_1f0,&local_220,&local_250,&local_280,&local_2b0,
                 &local_1c0,(SubstituteArg *)aVar14.descriptor);
      AddError(this,psVar5,&pTVar7->super_Message,NAME,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
    }
  }
  iVar19 = *(int *)(aVar14.descriptor + 0x68);
  lVar16 = 0;
  aVar15 = aVar14;
  while (lVar16 < iVar19) {
    pEVar1 = *(ExtensionRange **)pDVar4;
    for (lVar21 = 0; lVar21 < *(int *)(aVar14.descriptor + 0x88); lVar21 = lVar21 + 1) {
      pRVar2 = *(ReservedRange **)local_178;
      aVar14 = aVar15;
      if ((pRVar2[lVar21].start < pEVar1[lVar16].end) && (pEVar1[lVar16].start < pRVar2[lVar21].end)
         ) {
        psVar5 = *(string **)(aVar15.descriptor + 8);
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar16);
        strings::internal::SubstituteArg::SubstituteArg(&local_120,pEVar1[lVar16].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_c0,pEVar1[lVar16].end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_150,pRVar2[lVar21].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_f0,pRVar2[lVar21].end + -1);
        local_1f0.text_ = (char *)0x0;
        local_1f0.size_ = -1;
        local_220.text_ = (char *)0x0;
        local_220.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        local_280.text_ = (char *)0x0;
        local_280.size_ = -1;
        local_2b0.text_ = (char *)0x0;
        local_2b0.size_ = -1;
        local_1c0.text_ = (char *)0x0;
        local_1c0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_170,
                   (strings *)"Extension range $0 to $1 overlaps with reserved range $2 to $3.",
                   (char *)&local_120,&local_c0,&local_150,&local_f0,&local_1f0,&local_220,
                   &local_250,&local_280,&local_2b0,&local_1c0,(SubstituteArg *)aVar15.descriptor);
        AddError(this,psVar5,&pTVar8->super_Message,NUMBER,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        aVar14 = aVar15;
      }
      aVar15 = aVar14;
    }
    for (lVar21 = local_188; iVar19 = *(int *)(aVar14.descriptor + 0x68), (int)lVar21 < iVar19;
        lVar21 = lVar21 + 1) {
      pEVar3 = *(ExtensionRange **)pDVar4;
      aVar14 = aVar15;
      if ((pEVar3[lVar21].start < pEVar1[lVar16].end) && (pEVar1[lVar16].start < pEVar3[lVar21].end)
         ) {
        psVar5 = *(string **)(aVar15.descriptor + 8);
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,(int)lVar16);
        strings::internal::SubstituteArg::SubstituteArg(&local_120,pEVar3[lVar21].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_c0,pEVar3[lVar21].end + -1);
        strings::internal::SubstituteArg::SubstituteArg(&local_150,pEVar1[lVar16].start);
        strings::internal::SubstituteArg::SubstituteArg(&local_f0,pEVar1[lVar16].end + -1);
        local_1f0.text_ = (char *)0x0;
        local_1f0.size_ = -1;
        local_220.text_ = (char *)0x0;
        local_220.size_ = -1;
        local_250.text_ = (char *)0x0;
        local_250.size_ = -1;
        local_280.text_ = (char *)0x0;
        local_280.size_ = -1;
        local_2b0.text_ = (char *)0x0;
        local_2b0.size_ = -1;
        local_1c0.text_ = (char *)0x0;
        local_1c0.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&local_170,
                   (strings *)
                   "Extension range $0 to $1 overlaps with already-defined range $2 to $3.",
                   (char *)&local_120,&local_c0,&local_150,&local_f0,&local_1f0,&local_220,
                   &local_250,&local_280,&local_2b0,&local_1c0,(SubstituteArg *)aVar15.descriptor);
        AddError(this,psVar5,&pTVar8->super_Message,NUMBER,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        aVar14 = aVar15;
      }
      aVar15 = aVar14;
    }
    local_188 = local_188 + 1;
    lVar16 = lVar16 + 1;
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&reserved_name_set);
  return;
}

Assistant:

void DescriptorBuilder::BuildMessage(const DescriptorProto& proto,
                                     const Descriptor* parent,
                                     Descriptor* result) {
  const string& scope = (parent == NULL) ?
    file_->package() : parent->full_name();
  string* full_name = tables_->AllocateString(scope);
  if (!full_name->empty()) full_name->append(1, '.');
  full_name->append(proto.name());

  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_            = tables_->AllocateString(proto.name());
  result->full_name_       = full_name;
  result->file_            = file_;
  result->containing_type_ = parent;
  result->is_placeholder_  = false;
  result->is_unqualified_placeholder_ = false;

  // Build oneofs first so that fields and extension ranges can refer to them.
  BUILD_ARRAY(proto, result, oneof_decl     , BuildOneof         , result);
  BUILD_ARRAY(proto, result, field          , BuildField         , result);
  BUILD_ARRAY(proto, result, nested_type    , BuildMessage       , result);
  BUILD_ARRAY(proto, result, enum_type      , BuildEnum          , result);
  BUILD_ARRAY(proto, result, extension_range, BuildExtensionRange, result);
  BUILD_ARRAY(proto, result, extension      , BuildExtension     , result);
  BUILD_ARRAY(proto, result, reserved_range , BuildReservedRange , result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      tables_->AllocateArray<const string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] =
        tables_->AllocateString(proto.reserved_name(i));
  }

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  AddSymbol(result->full_name(), parent, result->name(),
            proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const DescriptorProto_ReservedRange& range1 = proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const DescriptorProto_ReservedRange& range2 = proto.reserved_range(j);
      if (range1.end() > range2.start() && range2.end() > range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Reserved range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2.start(), range2.end() - 1,
                                     range1.start(), range1.end() - 1));
      }
    }
  }

  hash_set<string> reserved_name_set;
  for (int i = 0; i < proto.reserved_name_size(); i++) {
    const string& name = proto.reserved_name(i);
    if (reserved_name_set.find(name) == reserved_name_set.end()) {
      reserved_name_set.insert(name);
    } else {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                 "Field name \"$0\" is reserved multiple times.",
                 name));
    }
  }

  for (int i = 0; i < result->field_count(); i++) {
    const FieldDescriptor* field = result->field(i);
    for (int j = 0; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range = result->extension_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.extension_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Extension range $0 to $1 includes field \"$2\" ($3).",
                   range->start, range->end - 1,
                   field->name(), field->number()));
      }
    }
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= field->number() && field->number() < range->end) {
        AddError(field->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute(
                   "Field \"$0\" uses reserved number $1.",
                   field->name(), field->number()));
      }
    }
    if (reserved_name_set.find(field->name()) != reserved_name_set.end()) {
      AddError(field->full_name(), proto.field(i),
               DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                 "Field name \"$0\" is reserved.", field->name()));
    }
  }

  // Check that extension ranges don't overlap and don't include
  // reserved field numbers.
  for (int i = 0; i < result->extension_range_count(); i++) {
    const Descriptor::ExtensionRange* range1 = result->extension_range(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const Descriptor::ReservedRange* range2 = result->reserved_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "reserved range $2 to $3.",
                                     range1->start, range1->end - 1,
                                     range2->start, range2->end - 1));
      }
    }
    for (int j = i + 1; j < result->extension_range_count(); j++) {
      const Descriptor::ExtensionRange* range2 = result->extension_range(j);
      if (range1->end > range2->start && range2->end > range1->start) {
        AddError(result->full_name(), proto.extension_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Extension range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2->start, range2->end - 1,
                                     range1->start, range1->end - 1));
      }
    }
  }
}